

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion.c
# Opt level: O0

int ion_alloc(int fd,size_t len,size_t align,uint heap_mask,uint flags,ion_user_handle_t *handle)

{
  size_t local_58;
  ion_allocation_data data;
  int ret;
  ion_user_handle_t *handle_local;
  uint flags_local;
  uint heap_mask_local;
  size_t align_local;
  size_t len_local;
  int fd_local;
  
  data.heap_id_mask = 0;
  if (handle == (ion_user_handle_t *)0x0) {
    len_local._4_4_ = -0x16;
  }
  else {
    local_58 = len;
    data.len = align;
    data.align._0_4_ = heap_mask;
    data.align._4_4_ = flags;
    len_local._4_4_ = ion_ioctl(fd,-0x3fdfb700,&local_58);
    if (-1 < len_local._4_4_) {
      *handle = data.heap_id_mask;
    }
  }
  return len_local._4_4_;
}

Assistant:

int ion_alloc(int fd, size_t len, size_t align, unsigned int heap_mask,
	      unsigned int flags, ion_user_handle_t *handle)
{
	int ret;
	struct ion_allocation_data data = {
		.len		= len,
		.align		= align,
		.heap_id_mask	= heap_mask,
		.flags		= flags,
	};

	if (handle == NULL)
		return -EINVAL;

	ret = ion_ioctl(fd, ION_IOC_ALLOC, &data);
	if (ret < 0)
		return ret;
	*handle = data.handle;
	return ret;
}